

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  JOCTET *pJVar1;
  short sVar2;
  int iVar3;
  undefined4 uVar4;
  jpeg_entropy_encoder *pjVar5;
  JBLOCKROW paJVar6;
  _func_void_j_compress_ptr *p_Var7;
  _func_void_j_compress_ptr_boolean *p_Var8;
  int *piVar9;
  jpeg_error_mgr *pjVar10;
  jpeg_destination_mgr *pjVar11;
  uint uVar12;
  boolean bVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  uint size;
  short local_ac;
  working_state state;
  
  pjVar5 = cinfo->entropy;
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  state.cur.put_buffer = (INT32)pjVar5[1].start_pass;
  state.cur._8_8_ = pjVar5[1].encode_mcu;
  state.cur.last_dc_val._4_8_ = pjVar5[1].finish_pass;
  state.cur._24_8_ = pjVar5[2].start_pass;
  state.cinfo = cinfo;
  if ((cinfo->restart_interval != 0) && (*(int *)&pjVar5[2].encode_mcu == 0)) {
    uVar4 = *(undefined4 *)((long)&pjVar5[2].encode_mcu + 4);
    bVar13 = flush_bits_s(&state);
    if (bVar13 == 0) {
      return 0;
    }
    pJVar1 = state.next_output_byte + 1;
    *state.next_output_byte = 0xff;
    state.free_in_buffer = state.free_in_buffer - 1;
    state.next_output_byte = pJVar1;
    if ((state.free_in_buffer == 0) && (bVar13 = dump_buffer_s(&state), bVar13 == 0)) {
      return 0;
    }
    pJVar1 = state.next_output_byte + 1;
    *state.next_output_byte = (char)uVar4 + 0xd0;
    state.free_in_buffer = state.free_in_buffer - 1;
    state.next_output_byte = pJVar1;
    if ((state.free_in_buffer == 0) && (bVar13 = dump_buffer_s(&state), bVar13 == 0)) {
      return 0;
    }
    uVar16 = 0;
    uVar20 = (ulong)(uint)(state.cinfo)->comps_in_scan;
    if ((state.cinfo)->comps_in_scan < 1) {
      uVar20 = uVar16;
    }
    for (; uVar20 != uVar16; uVar16 = uVar16 + 1) {
      state.cur.last_dc_val[uVar16] = 0;
    }
  }
  lVar15 = 0;
  do {
    if (cinfo->blocks_in_MCU <= lVar15) {
      pjVar11 = cinfo->dest;
      pjVar11->next_output_byte = state.next_output_byte;
      pjVar11->free_in_buffer = state.free_in_buffer;
      pjVar5[1].finish_pass = (_func_void_j_compress_ptr *)state.cur.last_dc_val._4_8_;
      pjVar5[2].start_pass = (_func_void_j_compress_ptr_boolean *)state.cur._24_8_;
      pjVar5[1].start_pass = (_func_void_j_compress_ptr_boolean *)state.cur.put_buffer;
      pjVar5[1].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)state.cur._8_8_;
      uVar12 = cinfo->restart_interval;
      if (uVar12 != 0) {
        uVar17 = *(uint *)&pjVar5[2].encode_mcu;
        if (*(uint *)&pjVar5[2].encode_mcu == 0) {
          *(uint *)((long)&pjVar5[2].encode_mcu + 4) =
               *(int *)((long)&pjVar5[2].encode_mcu + 4) + 1U & 7;
          uVar17 = uVar12;
        }
        *(uint *)&pjVar5[2].encode_mcu = uVar17 - 1;
      }
      return 1;
    }
    iVar3 = cinfo->MCU_membership[lVar15];
    paJVar6 = MCU_data[lVar15];
    p_Var7 = (&pjVar5[2].finish_pass)[cinfo->cur_comp_info[iVar3]->dc_tbl_no];
    p_Var8 = (&pjVar5[4].start_pass)[cinfo->cur_comp_info[iVar3]->ac_tbl_no];
    iVar14 = (state.cinfo)->lim_Se;
    piVar9 = (state.cinfo)->natural_order;
    uVar17 = (int)(*paJVar6)[0] - state.cur.last_dc_val[iVar3];
    uVar12 = -uVar17;
    if (0 < (int)uVar17) {
      uVar12 = uVar17;
    }
    lVar19 = 0;
    for (; uVar12 != 0; uVar12 = uVar12 >> 1) {
      lVar19 = lVar19 + 1;
    }
    uVar12 = (uint)lVar19;
    if (0xb < uVar12) {
      pjVar10 = (state.cinfo)->err;
      pjVar10->msg_code = 6;
      (*pjVar10->error_exit)((j_common_ptr)state.cinfo);
    }
    bVar13 = emit_bits_s(&state,*(uint *)(p_Var7 + lVar19 * 4),(int)(char)p_Var7[lVar19 + 0x400]);
    if (bVar13 == 0) {
      return 0;
    }
    if ((uVar12 != 0) &&
       (bVar13 = emit_bits_s(&state,((int)uVar17 >> 0x1f) + uVar17,uVar12), bVar13 == 0)) {
      return 0;
    }
    iVar21 = 0;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (uVar20 = 1; uVar20 != iVar14 + 1; uVar20 = uVar20 + 1) {
      sVar2 = (*paJVar6)[piVar9[uVar20]];
      uVar12 = (uint)sVar2;
      if (sVar2 == 0) {
        iVar21 = iVar21 + 1;
      }
      else {
        iVar18 = iVar21 * 0x10 + 1;
        for (; 0xf < iVar21; iVar21 = iVar21 + -0x10) {
          bVar13 = emit_bits_s(&state,*(uint *)(p_Var8 + 0x3c0),(int)(char)p_Var8[0x4f0]);
          if (bVar13 == 0) {
            return 0;
          }
          iVar18 = iVar18 + -0x100;
        }
        uVar17 = -uVar12;
        if (0 < (int)uVar12) {
          uVar17 = uVar12;
        }
        size = 1;
        for (; 1 < uVar17; uVar17 = uVar17 >> 1) {
          size = size + 1;
          iVar18 = iVar18 + 1;
        }
        if (10 < size) {
          pjVar10 = (state.cinfo)->err;
          pjVar10->msg_code = 6;
          (*pjVar10->error_exit)((j_common_ptr)state.cinfo);
        }
        bVar13 = emit_bits_s(&state,*(uint *)(p_Var8 + (long)iVar18 * 4),
                             (int)(char)p_Var8[(long)iVar18 + 0x400]);
        if (bVar13 == 0) {
          return 0;
        }
        local_ac = (short)(uVar12 >> 0xf);
        bVar13 = emit_bits_s(&state,(int)local_ac + uVar12,size);
        iVar21 = 0;
        if (bVar13 == 0) {
          return 0;
        }
      }
    }
    if ((0 < iVar21) &&
       (bVar13 = emit_bits_s(&state,*(uint *)p_Var8,(int)(char)p_Var8[0x400]), bVar13 == 0)) {
      return 0;
    }
    state.cur.last_dc_val[iVar3] = (int)(*MCU_data[lVar15])[0];
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  ASSIGN_STATE(state.cur, entropy->saved);
  state.cinfo = cinfo;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! emit_restart_s(&state, entropy->next_restart_num))
	return FALSE;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    if (! encode_one_block(&state,
			   MCU_data[blkn][0], state.cur.last_dc_val[ci],
			   entropy->dc_derived_tbls[compptr->dc_tbl_no],
			   entropy->ac_derived_tbls[compptr->ac_tbl_no]))
      return FALSE;
    /* Update last_dc_val */
    state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  ASSIGN_STATE(entropy->saved, state.cur);

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}